

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall
glu::Texture2D::loadCompressed
          (Texture2D *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  undefined8 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  PixelBufferAccess refLevelAccess;
  long lVar4;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  dVar3 = getGLFormat(levels->m_format);
  if (this->m_glTexture == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_glTexture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0xc0);
  }
  else {
    (**(code **)(lVar4 + 0xb8))(0xde1);
    uVar5 = 0;
    uVar6 = (ulong)(uint)numLevels;
    if (numLevels < 1) {
      uVar6 = uVar5;
    }
    uVar7 = 0;
    while( true ) {
      if (uVar6 == uVar7) {
        dVar3 = (**(code **)(lVar4 + 0x800))();
        checkError(dVar3,"Texture upload failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0xd3);
        return;
      }
      tcu::Texture2D::allocLevel(&this->m_refTexture,(int)uVar7);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&refLevelAccess.super_ConstPixelBufferAccess,
                 (ConstPixelBufferAccess *)
                 ((long)(((this->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + (uVar5 - 8)));
      if ((*(int *)((long)&levels->m_width + uVar5) !=
           refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[0]) ||
         (*(int *)((long)&levels->m_height + uVar5) !=
          refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[1])) break;
      tcu::CompressedTexture::decompress
                ((CompressedTexture *)((long)&levels->m_format + uVar5),
                 (PixelBufferAccess *)&refLevelAccess.super_ConstPixelBufferAccess,
                 decompressionParams);
      uVar1 = *(undefined8 *)
               ((long)&(levels->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar5);
      (**(code **)(lVar4 + 0x288))
                (0xde1,uVar7 & 0xffffffff,dVar3,*(undefined4 *)((long)&levels->m_width + uVar5),
                 *(undefined4 *)((long)&levels->m_height + uVar5),0,
                 *(int *)((long)&(levels->m_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + uVar5) - (int)uVar1,
                 uVar1);
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + 0x28;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,
               "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight()"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0xcb);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture2D::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage2D(GL_TEXTURE_2D, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}